

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

bool __thiscall
google::protobuf::stringpiece_internal::StringPiece::ends_with(StringPiece *this,StringPiece x)

{
  int iVar1;
  ulong __n;
  bool local_21;
  StringPiece *this_local;
  StringPiece x_local;
  
  __n = x.length_;
  local_21 = false;
  if (__n <= this->length_) {
    iVar1 = memcmp(this->ptr_ + (this->length_ - __n),x.ptr_,__n);
    local_21 = iVar1 == 0;
  }
  return local_21;
}

Assistant:

bool ends_with(StringPiece x) const {
    return ((length_ >= x.length_) &&
            (memcmp(ptr_ + (length_-x.length_), x.ptr_,
                 static_cast<size_t>(x.length_)) == 0));
  }